

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  int *piVar1;
  ushort uVar2;
  int iVar3;
  float *pfVar4;
  unsigned_short *puVar5;
  float fVar6;
  float fVar7;
  ImWchar IVar8;
  undefined2 uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  int iVar13;
  float *pfVar14;
  Glyph *pGVar15;
  ImGuiContext *pIVar16;
  Glyph *pGVar17;
  char *__function;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  float fVar24;
  
  uVar22 = (this->Glyphs).Size;
  if ((ulong)uVar22 == 0) {
    uVar23 = 1;
  }
  else {
    uVar23 = 0;
    uVar20 = 0;
    if (0 < (int)uVar22) {
      uVar20 = uVar22;
    }
    if (uVar20 <= uVar22 - 1) {
      __function = "value_type &ImVector<ImFont::Glyph>::operator[](int) [T = ImFont::Glyph]";
      goto LAB_00153f82;
    }
    lVar18 = 0;
    do {
      uVar2 = *(ushort *)((long)&((this->Glyphs).Data)->Codepoint + lVar18);
      uVar20 = (uint)uVar2;
      if (uVar2 < uVar23) {
        uVar20 = uVar23;
      }
      uVar23 = uVar20;
      lVar18 = lVar18 + 0x28;
    } while ((ulong)uVar22 * 0x28 != lVar18);
    if (0xfffe < (int)uVar22) {
      __assert_fail("Glyphs.Size < 0xFFFF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                    ,0x6af,"void ImFont::BuildLookupTable()");
    }
    uVar23 = uVar23 + 1;
  }
  pfVar4 = (this->IndexXAdvance).Data;
  if (pfVar4 != (float *)0x0) {
    (this->IndexXAdvance).Size = 0;
    pIVar16 = GImGui;
    (this->IndexXAdvance).Capacity = 0;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar16->IO).MemFreeFn)(pfVar4);
    (this->IndexXAdvance).Data = (float *)0x0;
  }
  puVar5 = (this->IndexLookup).Data;
  if (puVar5 != (unsigned_short *)0x0) {
    (this->IndexLookup).Size = 0;
    pIVar16 = GImGui;
    (this->IndexLookup).Capacity = 0;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar16->IO).MemFreeFn)(puVar5);
    (this->IndexLookup).Data = (unsigned_short *)0x0;
  }
  GrowIndex(this,uVar23);
  uVar22 = (this->Glyphs).Size;
  uVar21 = (ulong)uVar22;
  if (0 < (int)uVar22) {
    iVar13 = (this->IndexXAdvance).Size;
    pfVar4 = (this->IndexXAdvance).Data;
    iVar3 = (this->IndexLookup).Size;
    puVar5 = (this->IndexLookup).Data;
    pfVar14 = &((this->Glyphs).Data)->XAdvance;
    uVar19 = 0;
    do {
      if (iVar13 <= (int)(uint)((Glyph *)(pfVar14 + -1))->Codepoint) goto LAB_00153f56;
      uVar20 = (uint)((Glyph *)(pfVar14 + -1))->Codepoint;
      pfVar4[uVar20] = *pfVar14;
      if (iVar3 <= (int)uVar20) goto LAB_00153f6d;
      puVar5[uVar20] = (unsigned_short)uVar19;
      uVar19 = uVar19 + 1;
      pfVar14 = pfVar14 + 10;
    } while (uVar21 != uVar19);
  }
  pIVar16 = GImGui;
  iVar13 = (this->IndexLookup).Size;
  if ((iVar13 < 0x21) || (uVar2 = (this->IndexLookup).Data[0x20], uVar2 == 0xffff)) {
    pGVar15 = this->FallbackGlyph;
  }
  else {
    pGVar15 = (Glyph *)((long)&((this->Glyphs).Data)->Codepoint + (ulong)((uint)uVar2 * 0x28));
  }
  if (pGVar15 == (Glyph *)0x0) {
LAB_00153edc:
    if (((int)(uint)this->FallbackChar < iVar13) &&
       (uVar21 = (ulong)(this->IndexLookup).Data[this->FallbackChar], uVar21 != 0xffff)) {
      pGVar17 = (this->Glyphs).Data;
      pGVar15 = pGVar17 + uVar21;
      this->FallbackGlyph = pGVar15;
      if (pGVar17 == (Glyph *)0x0) goto LAB_00153f18;
      fVar24 = pGVar15->XAdvance;
    }
    else {
      this->FallbackGlyph = (Glyph *)0x0;
LAB_00153f18:
      fVar24 = 0.0;
    }
    this->FallbackXAdvance = fVar24;
    uVar22 = (this->IndexXAdvance).Size;
    pfVar4 = (this->IndexXAdvance).Data;
    uVar19 = 0;
    uVar21 = (ulong)uVar22;
    if ((int)uVar22 < 1) {
      uVar21 = uVar19;
    }
    while (uVar21 != uVar19) {
      pfVar14 = pfVar4 + uVar19;
      if (*pfVar14 <= 0.0 && *pfVar14 != 0.0) {
        pfVar4[uVar19] = fVar24;
      }
      uVar19 = uVar19 + 1;
      if (uVar23 == uVar19) {
        return;
      }
    }
  }
  else {
    if ((int)uVar22 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                    ,0x35d,"value_type &ImVector<ImFont::Glyph>::back() [T = ImFont::Glyph]");
    }
    pGVar15 = (this->Glyphs).Data;
    if (pGVar15[uVar21 - 1].Codepoint != 9) {
      uVar21 = uVar21 + 1;
      iVar3 = (this->Glyphs).Capacity;
      if (iVar3 <= (int)uVar22) {
        if (iVar3 == 0) {
          uVar22 = 8;
        }
        else {
          uVar22 = iVar3 / 2 + iVar3;
        }
        uVar19 = (ulong)uVar22;
        if ((int)uVar22 <= (int)uVar21) {
          uVar19 = uVar21 & 0xffffffff;
        }
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        pGVar15 = (Glyph *)(*(pIVar16->IO).MemAllocFn)(uVar19 * 0x28);
        pGVar17 = (this->Glyphs).Data;
        if (pGVar17 == (Glyph *)0x0) {
LAB_00153e3f:
          pGVar17 = (Glyph *)0x0;
          pIVar16 = GImGui;
        }
        else {
          memcpy(pGVar15,pGVar17,(long)(this->Glyphs).Size * 0x28);
          pIVar16 = GImGui;
          pGVar17 = (this->Glyphs).Data;
          if (pGVar17 == (Glyph *)0x0) goto LAB_00153e3f;
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(pIVar16->IO).MemFreeFn)(pGVar17);
        (this->Glyphs).Data = pGVar15;
        (this->Glyphs).Capacity = (int)uVar19;
        iVar13 = (this->IndexLookup).Size;
      }
      (this->Glyphs).Size = (int)uVar21;
    }
    if ((iVar13 < 0x21) || (uVar19 = (ulong)(this->IndexLookup).Data[0x20], uVar19 == 0xffff)) {
      pGVar17 = this->FallbackGlyph;
    }
    else {
      pGVar17 = pGVar15 + uVar19;
    }
    fVar24 = pGVar17->V1;
    pGVar15[uVar21 - 1].U1 = pGVar17->U1;
    pGVar15[uVar21 - 1].V1 = fVar24;
    IVar8 = pGVar17->Codepoint;
    uVar9 = *(undefined2 *)&pGVar17->field_0x2;
    fVar10 = pGVar17->XAdvance;
    fVar11 = pGVar17->X0;
    fVar12 = pGVar17->Y0;
    fVar24 = pGVar17->Y1;
    fVar6 = pGVar17->U0;
    fVar7 = pGVar17->V0;
    pGVar15[uVar21 - 1].X1 = pGVar17->X1;
    pGVar15[uVar21 - 1].Y1 = fVar24;
    pGVar15[uVar21 - 1].U0 = fVar6;
    pGVar15[uVar21 - 1].V0 = fVar7;
    pGVar17 = pGVar15 + (uVar21 - 1);
    pGVar17->Codepoint = IVar8;
    *(undefined2 *)&pGVar17->field_0x2 = uVar9;
    pGVar17->XAdvance = fVar10;
    pGVar15[uVar21 - 1].X0 = fVar11;
    pGVar15[uVar21 - 1].Y0 = fVar12;
    pGVar15[uVar21 - 1].Codepoint = 9;
    fVar24 = pGVar15[uVar21 - 1].XAdvance * 4.0;
    pGVar15[uVar21 - 1].XAdvance = fVar24;
    if (9 < (this->IndexXAdvance).Size) {
      (this->IndexXAdvance).Data[9] = fVar24;
      iVar13 = (this->IndexLookup).Size;
      if (iVar13 < 10) {
LAB_00153f6d:
        __function = "value_type &ImVector<unsigned short>::operator[](int) [T = unsigned short]";
        goto LAB_00153f82;
      }
      (this->IndexLookup).Data[9] = (short)(this->Glyphs).Size - 1;
      goto LAB_00153edc;
    }
  }
LAB_00153f56:
  __function = "value_type &ImVector<float>::operator[](int) [T = float]";
LAB_00153f82:
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                ,0x353,__function);
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexXAdvance.clear();
    IndexLookup.clear();
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexXAdvance[codepoint] = Glyphs[i].XAdvance;
        IndexLookup[codepoint] = (unsigned short)i;
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((unsigned short)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times
            Glyphs.resize(Glyphs.Size + 1);
        ImFont::Glyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((unsigned short)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.XAdvance *= 4;
        IndexXAdvance[(int)tab_glyph.Codepoint] = (float)tab_glyph.XAdvance;
        IndexLookup[(int)tab_glyph.Codepoint] = (unsigned short)(Glyphs.Size-1);
    }

    FallbackGlyph = NULL;
    FallbackGlyph = FindGlyph(FallbackChar);
    FallbackXAdvance = FallbackGlyph ? FallbackGlyph->XAdvance : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexXAdvance[i] < 0.0f)
            IndexXAdvance[i] = FallbackXAdvance;
}